

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::compatibilityInitialize(DeepScanLineInputFile *this,IStream *is)

{
  DeepScanLineInputFile *this_00;
  long *in_RSI;
  InputPartData *in_RDI;
  InputPartData *part;
  bool in_stack_000001b3;
  int in_stack_000001b4;
  IStream *in_stack_000001b8;
  MultiPartInputFile *in_stack_000001c0;
  
  (**(code **)(*in_RSI + 0x30))(in_RSI,0);
  *(undefined1 *)
   (*(long *)&(in_RDI->header)._map._M_t._M_impl.super__Rb_tree_header._M_header + 0x174) = 1;
  this_00 = (DeepScanLineInputFile *)operator_new(0x10);
  MultiPartInputFile::MultiPartInputFile
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b3);
  *(DeepScanLineInputFile **)
   (*(long *)&(in_RDI->header)._map._M_t._M_impl.super__Rb_tree_header._M_header + 0x178) = this_00;
  MultiPartInputFile::getPart((MultiPartInputFile *)this_00,(int)((ulong)in_RDI >> 0x20));
  multiPartInitialize(this_00,in_RDI);
  return;
}

Assistant:

void
DeepScanLineInputFile::compatibilityInitialize (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is)
{
    is.seekg (0);
    //
    // Construct a MultiPartInputFile, initialize TiledInputFile
    // with the part 0 data.
    // (TODO) maybe change the third parameter of the constructor of MultiPartInputFile later.
    //
    _data->multiPartBackwardSupport = true;
    _data->multiPartFile = new MultiPartInputFile (is, _data->numThreads);
    InputPartData* part  = _data->multiPartFile->getPart (0);

    multiPartInitialize (part);
}